

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O0

bool __thiscall btLemkeAlgorithm::LexicographicPositive(btLemkeAlgorithm *this,btVectorXf *v)

{
  int iVar1;
  float *pfVar2;
  btScalar bVar3;
  double dVar4;
  int i;
  uint in_stack_ffffffffffffffe0;
  uint uVar5;
  int index;
  int iVar6;
  
  index = 0;
  while( true ) {
    iVar6 = index;
    iVar1 = btVectorX<float>::size((btVectorX<float> *)0x2662d8);
    uVar5 = in_stack_ffffffffffffffe0 & 0xffffff;
    if (index < iVar1 + -1) {
      pfVar2 = btVectorX<float>::operator[]
                         ((btVectorX<float> *)
                          (CONCAT44(iVar6,in_stack_ffffffffffffffe0) & 0xffffffff00ffffff),index);
      dVar4 = std::fabs((double)(ulong)(uint)*pfVar2);
      bVar3 = btMachEps();
      uVar5 = CONCAT13(SUB84(dVar4,0) < bVar3,(int3)uVar5);
    }
    if ((char)(uVar5 >> 0x18) == '\0') break;
    index = iVar6 + 1;
    in_stack_ffffffffffffffe0 = uVar5;
  }
  pfVar2 = btVectorX<float>::operator[]((btVectorX<float> *)CONCAT44(iVar6,uVar5),index);
  return 0.0 < *pfVar2;
}

Assistant:

bool btLemkeAlgorithm::LexicographicPositive(const btVectorXu & v)
{
    int i = 0;
  //  if (DEBUGLEVEL)
    //  cout << "v " << v << endl;

    while(i < v.size()-1 && fabs(v[i]) < btMachEps())
      i++;
    if (v[i] > 0)
      return true;

    return false;
  }